

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O1

void __thiscall CaDiCaL::LratChecker::dump(LratChecker *this)

{
  uint uVar1;
  ulong uVar2;
  uint64_t uVar3;
  LratCheckerClause *pLVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (this->size_clauses == 0) {
    uVar7 = 0;
  }
  else {
    uVar3 = 0;
    uVar7 = 0;
    do {
      for (pLVar4 = this->clauses[uVar3]; pLVar4 != (LratCheckerClause *)0x0; pLVar4 = pLVar4->next)
      {
        if ((ulong)pLVar4->size != 0) {
          uVar6 = 0;
          do {
            uVar1 = pLVar4->literals[uVar6];
            uVar5 = -uVar1;
            if (0 < (int)uVar1) {
              uVar5 = uVar1;
            }
            uVar2 = (ulong)uVar5;
            if ((int)uVar5 <= (int)uVar7) {
              uVar2 = uVar7;
            }
            uVar7 = uVar2;
            uVar6 = uVar6 + 1;
          } while (pLVar4->size != uVar6);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != this->size_clauses);
  }
  printf("p cnf %d %lu\n",uVar7,this->num_clauses);
  if (this->size_clauses != 0) {
    uVar7 = 0;
    do {
      for (pLVar4 = this->clauses[uVar7]; pLVar4 != (LratCheckerClause *)0x0; pLVar4 = pLVar4->next)
      {
        if (pLVar4->size != 0) {
          uVar6 = 0;
          do {
            printf("%d ",(ulong)(uint)pLVar4->literals[uVar6]);
            uVar6 = uVar6 + 1;
          } while (uVar6 < pLVar4->size);
        }
        puts("0");
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->size_clauses);
  }
  return;
}

Assistant:

void LratChecker::dump () {
  int max_var = 0;
  for (uint64_t i = 0; i < size_clauses; i++)
    for (LratCheckerClause *c = clauses[i]; c; c = c->next)
      for (unsigned i = 0; i < c->size; i++)
        if (abs (c->literals[i]) > max_var)
          max_var = abs (c->literals[i]);
  printf ("p cnf %d %" PRIu64 "\n", max_var, num_clauses);
  for (uint64_t i = 0; i < size_clauses; i++)
    for (LratCheckerClause *c = clauses[i]; c; c = c->next) {
      for (unsigned i = 0; i < c->size; i++)
        printf ("%d ", c->literals[i]);
      printf ("0\n");
    }
}